

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O0

int obudec_read_obu_header_and_size
              (AvxInputContext *input_ctx,size_t buffer_capacity,int is_annexb,uint8_t *buffer,
              size_t *bytes_read,size_t *payload_length,ObuHeader *obu_header,_Bool buffered)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  AvxInputContext *in_R9;
  uint64_t u64_payload_length;
  size_t header_size;
  uint64_t obu_size;
  size_t leb128_length_payload;
  size_t leb128_length_obu;
  size_t kMinimumBufferSize;
  undefined8 in_stack_ffffffffffffff98;
  size_t *bytes_read_00;
  ObuHeader *obu_header_00;
  uint8_t *obu_data;
  undefined7 in_stack_ffffffffffffffc0;
  int local_4;
  
  bVar1 = (byte)header_size & 1;
  iVar3 = 0;
  if ((((in_RDI == 0) || (in_RCX == 0)) || (in_R8 == 0)) ||
     (((in_R9 == (AvxInputContext *)0x0 || (u64_payload_length == 0)) || (in_RSI < 0x12)))) {
    return -1;
  }
  obu_data = (uint8_t *)0x0;
  obu_header_00 = (ObuHeader *)0x0;
  bytes_read_00 = (size_t *)0x0;
  if (in_EDX != 0) {
    iVar3 = 0;
    iVar2 = obudec_read_leb128((AvxInputContext *)0x12,(uint8_t *)0x0,(size_t *)0x0,(uint64_t *)0x0,
                               SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
    if (iVar2 != 0) {
      fprintf(_stderr,"obudec: Failure reading OBU size length.\n");
      return -1;
    }
    if (obu_data == (uint8_t *)0x0) {
      in_R9->filename = (char *)0x0;
      return 0;
    }
    if ((size_t *)0xffffffff < bytes_read_00) {
      fprintf(_stderr,"obudec: OBU payload length too large.\n");
      return -1;
    }
  }
  iVar3 = obudec_read_obu_header
                    (in_R9,CONCAT17(bVar1,in_stack_ffffffffffffffc0),iVar3,obu_data,obu_header_00,
                     bytes_read_00,false);
  if (iVar3 == 0) {
    in_R9->filename = (char *)0x0;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int obudec_read_obu_header_and_size(
    struct AvxInputContext *input_ctx, size_t buffer_capacity, int is_annexb,
    uint8_t *buffer, size_t *bytes_read, size_t *payload_length,
    ObuHeader *obu_header, bool buffered) {
  const size_t kMinimumBufferSize = OBU_MAX_HEADER_SIZE;
  if (!input_ctx || !buffer || !bytes_read || !payload_length || !obu_header ||
      buffer_capacity < kMinimumBufferSize) {
    return -1;
  }

  size_t leb128_length_obu = 0;
  size_t leb128_length_payload = 0;
  uint64_t obu_size = 0;
  if (is_annexb) {
    if (obudec_read_leb128(input_ctx, &buffer[0], &leb128_length_obu, &obu_size,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU size length.\n");
      return -1;
    } else if (leb128_length_obu == 0) {
      *payload_length = 0;
      return 0;
    }
    if (obu_size > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }
  }

  size_t header_size = 0;
  if (obudec_read_obu_header(input_ctx, buffer_capacity - leb128_length_obu,
                             is_annexb, buffer + leb128_length_obu, obu_header,
                             &header_size, buffered) != 0) {
    return -1;
  } else if (header_size == 0) {
    *payload_length = 0;
    return 0;
  }

  if (!obu_header->has_size_field) {
    assert(is_annexb);
    if (obu_size < header_size) {
      fprintf(stderr, "obudec: OBU size is too small.\n");
      return -1;
    }
    *payload_length = (size_t)obu_size - header_size;
  } else {
    uint64_t u64_payload_length = 0;
    if (obudec_read_leb128(input_ctx, &buffer[leb128_length_obu + header_size],
                           &leb128_length_payload, &u64_payload_length,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU payload length.\n");
      return -1;
    }
    if (u64_payload_length > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }

    *payload_length = (size_t)u64_payload_length;
  }

  *bytes_read = leb128_length_obu + header_size + leb128_length_payload;
  return 0;
}